

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O2

void __thiscall Fl_Font_Descriptor::~Fl_Font_Descriptor(Fl_Font_Descriptor *this)

{
  if (fl_graphics_driver->font_descriptor_ == this) {
    fl_graphics_driver->font_descriptor_ = (Fl_Font_Descriptor *)0x0;
    fl_xfont.ptr = (XFontStruct *)0x0;
  }
  XFreeUtf8FontStruct(fl_display,this->font);
  return;
}

Assistant:

Fl_Font_Descriptor::~Fl_Font_Descriptor() {
#  if HAVE_GL
// Delete list created by gl_draw().  This is not done by this code
// as it will link in GL unnecessarily.  There should be some kind
// of "free" routine pointer, or a subclass?
// if (listbase) {
//  int base = font->min_char_or_byte2;
//  int size = font->max_char_or_byte2-base+1;
//  int base = 0; int size = 256;
//  glDeleteLists(listbase+base,size);
// }
#  endif
  if (this == fl_graphics_driver->font_descriptor()) {
    fl_graphics_driver->font_descriptor(NULL);
    fl_xfont = 0;
  }
  XFreeUtf8FontStruct(fl_display, font);
}